

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

string * __thiscall
ArrayType::surroundName(string *__return_storage_ptr__,ArrayType *this,string *name)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  undefined8 uVar6;
  string ret;
  string local_d0;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  if ((this->isPointerArray != true) || (this->pointer->isArrayPointer != true)) {
    sizeToString_abi_cxx11_(&local_d0,this);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_d0,0,(char *)0x0,(ulong)(name->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0015e813;
  }
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x168f20);
  if (this->pointer->levels != 0) {
    uVar5 = 0;
    do {
      std::__cxx11::string::append((char *)&local_90);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->pointer->levels);
  }
  std::operator+(&local_50,&local_90,name);
  sizeToString_abi_cxx11_(&local_70,this);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    uVar6 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_70._M_string_length + local_50._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar6 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_70._M_string_length + local_50._M_string_length) goto LAB_0015e601;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_70,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
  }
  else {
LAB_0015e601:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  }
  local_b0 = &local_a0;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_a0 = *plVar3;
    uStack_98 = puVar2[3];
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*puVar2;
  }
  local_a8 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(this->pointer->sizes)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0015e813:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayType::surroundName(const std::string& name) {
    std::string ret;
    if (isPointerArray && pointer->isArrayPointer) {
        ret = "(";
        for (unsigned i = 0; i < pointer->levels; i++) {
            ret += "*";
        }
        return ret + name + sizeToString() + ")" + pointer->sizes;
    } else {
        return name + sizeToString();
    }
}